

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O3

char * hostname(void)

{
  char *pcVar1;
  
  if (hostname_first == '\0') {
    gethostname(hostname::val,0x100);
    hostname_first = '\x01';
  }
  pcVar1 = strdup(hostname::val);
  return pcVar1;
}

Assistant:

char* hostname() {
  static char val[256];
  static int first = 1;
  if (first) {
    gethostname(&val[0],256);
    first = 0;
  }
  return strdup(&val[0]);
}